

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

ImportInfo * __thiscall cmGeneratorTarget::GetImportInfo(cmGeneratorTarget *this,string *config)

{
  iterator iVar1;
  ImportInfo *pIVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>,_bool>
  pVar3;
  string config_upper;
  ImportInfo info;
  value_type entry;
  key_type local_268;
  ImportInfo local_248;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>
  local_140;
  
  if (this->Target->IsImportedTarget == true) {
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    local_268._M_string_length = 0;
    local_268.field_2._M_local_buf[0] = '\0';
    if (config->_M_string_length == 0) {
      std::__cxx11::string::assign((char *)&local_268);
    }
    else {
      cmsys::SystemTools::UpperCase(&local_140.first,config);
      std::__cxx11::string::operator=((string *)&local_268,(string *)&local_140);
      std::__cxx11::string::~string((string *)&local_140);
    }
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>_>_>
            ::find(&(this->ImportInfoMap)._M_t,&local_268);
    if ((_Rb_tree_header *)iVar1._M_node ==
        &(this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header) {
      local_248.Location._M_dataplus._M_p = (pointer)&local_248.Location.field_2;
      local_248.NoSOName = false;
      local_248.Multiplicity = 0;
      local_248.Location._M_string_length = 0;
      local_248.Location.field_2._M_local_buf[0] = '\0';
      local_248.SOName._M_dataplus._M_p = (pointer)&local_248.SOName.field_2;
      local_248.SOName._M_string_length = 0;
      local_248.SOName.field_2._M_local_buf[0] = '\0';
      local_248.ImportLibrary._M_dataplus._M_p = (pointer)&local_248.ImportLibrary.field_2;
      local_248.ImportLibrary._M_string_length = 0;
      local_248.ImportLibrary.field_2._M_local_buf[0] = '\0';
      local_248.LibName._M_dataplus._M_p = (pointer)&local_248.LibName.field_2;
      local_248.LibName._M_string_length = 0;
      local_248.LibName.field_2._M_local_buf[0] = '\0';
      local_248.Languages._M_dataplus._M_p = (pointer)&local_248.Languages.field_2;
      local_248.Languages._M_string_length = 0;
      local_248.Languages.field_2._M_local_buf[0] = '\0';
      local_248.Libraries._M_dataplus._M_p = (pointer)&local_248.Libraries.field_2;
      local_248.Libraries._M_string_length = 0;
      local_248.Libraries.field_2._M_local_buf[0] = '\0';
      local_248.LibrariesProp._M_dataplus._M_p = (pointer)&local_248.LibrariesProp.field_2;
      local_248.LibrariesProp._M_string_length = 0;
      local_248.LibrariesProp.field_2._M_local_buf[0] = '\0';
      local_248.SharedDeps._M_dataplus._M_p = (pointer)&local_248.SharedDeps.field_2;
      local_248.SharedDeps._M_string_length = 0;
      local_248.SharedDeps.field_2._M_local_buf[0] = '\0';
      ComputeImportInfo(this,&local_268,&local_248);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::ImportInfo_&,_true>
                (&local_140,&local_268,&local_248);
      pVar3 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>>
              ::
              _M_emplace_unique<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>&>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ImportInfo>>>
                          *)&this->ImportInfoMap,&local_140);
      iVar1._M_node = (_Base_ptr)pVar3.first._M_node;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ImportInfo>
      ::~pair(&local_140);
      ImportInfo::~ImportInfo(&local_248);
    }
    if (((this->Target->TargetTypeValue == INTERFACE_LIBRARY) ||
        (iVar1._M_node[2]._M_left != (_Base_ptr)0x0)) ||
       (iVar1._M_node[4]._M_left != (_Base_ptr)0x0)) {
      pIVar2 = (ImportInfo *)(iVar1._M_node + 2);
    }
    else {
      pIVar2 = (ImportInfo *)0x0;
    }
    std::__cxx11::string::~string((string *)&local_268);
  }
  else {
    pIVar2 = (ImportInfo *)0x0;
  }
  return pIVar2;
}

Assistant:

bool cmGeneratorTarget::IsImported() const
{
  return this->Target->IsImported();
}